

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

void __thiscall
MeCab::EncoderFeatureIndex::shrink
          (EncoderFeatureIndex *this,size_t freq,vector<double,_std::allocator<double>_> *observed)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var3;
  _Rb_tree_color _Var4;
  _Rb_tree_color _Var5;
  size_t sVar6;
  pointer pdVar7;
  EncoderFeatureIndex *pEVar8;
  _Rb_tree_node_base *p_Var9;
  pointer puVar10;
  _Base_ptr p_Var11;
  const_iterator __position;
  _Base_ptr p_Var12;
  int *piVar13;
  long lVar14;
  int *piVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  _Self __tmp;
  pointer puVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  vector<double,_std::allocator<double>_> observed_new;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqv;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> old2new;
  allocator_type local_a9;
  EncoderFeatureIndex *local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<double,_std::allocator<double>_> *local_68;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = observed;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_88,(this->super_FeatureIndex).maxid_);
  puVar20 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (p_Var9 = *(_Rb_tree_node_base **)&this->field_0x1b8;
      p_Var9 != (_Rb_tree_node_base *)&this->field_0x1a8;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    piVar13 = *(int **)(p_Var9 + 2);
    iVar22 = *piVar13;
    while (iVar22 != -1) {
      piVar13 = piVar13 + 1;
      puVar20[iVar22] = (long)&(p_Var9[2]._M_parent)->_M_color + puVar20[iVar22];
      iVar22 = *piVar13;
    }
  }
  if (1 < freq) {
    (this->super_FeatureIndex).maxid_ = 0;
    p_Var3 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8 = this;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar20) {
      uVar21 = 0;
      puVar10 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        if (freq <= puVar20[uVar21]) {
          sVar6 = (local_a8->super_FeatureIndex).maxid_;
          (local_a8->super_FeatureIndex).maxid_ = sVar6 + 1;
          local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (int)uVar21;
          local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = (int)sVar6;
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<std::pair<int,int>>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)&local_60,(pair<int,_int> *)&local_a0);
          puVar10 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          puVar20 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (ulong)((long)puVar10 - (long)puVar20 >> 3));
    }
    __position._M_node = (local_a8->dic_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(local_a8->dic_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var2) {
      this_00 = &local_a8->dic_;
      do {
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0010c7a0:
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::_M_erase_aux(&this_00->_M_t,__position);
          __position._M_node = p_Var11;
        }
        else {
          _Var4 = __position._M_node[2]._M_color;
          p_Var12 = &p_Var3->_M_header;
          p_Var18 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            p_Var16 = p_Var18;
            p_Var19 = p_Var12;
            _Var5 = p_Var16[1]._M_color;
            p_Var12 = p_Var16;
            if ((int)_Var5 < (int)_Var4) {
              p_Var12 = p_Var19;
            }
            p_Var18 = (&p_Var16->_M_left)[(int)_Var5 < (int)_Var4];
          } while ((&p_Var16->_M_left)[(int)_Var5 < (int)_Var4] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var12 == p_Var3) goto LAB_0010c7a0;
          if ((int)_Var5 < (int)_Var4) {
            p_Var16 = p_Var19;
          }
          if ((int)_Var4 < (int)p_Var16[1]._M_color) goto LAB_0010c7a0;
          __position._M_node[2]._M_color = *(_Rb_tree_color *)&p_Var12[1].field_0x4;
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
      } while ((_Rb_tree_header *)__position._M_node != p_Var2);
    }
    p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    pEVar8 = local_a8;
    for (p_Var9 = *(_Rb_tree_node_base **)&local_a8->field_0x1b8;
        p_Var9 != (_Rb_tree_node_base *)&this->field_0x1a8;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      piVar13 = *(int **)(p_Var9 + 2);
      iVar22 = *piVar13;
      piVar15 = piVar13;
      while (iVar22 != -1) {
        p_Var18 = &p_Var3->_M_header;
        p_Var16 = p_Var12;
        if (p_Var12 != (_Base_ptr)0x0) {
          do {
            p_Var19 = p_Var16;
            p_Var17 = p_Var18;
            _Var4 = p_Var19[1]._M_color;
            p_Var18 = p_Var19;
            if ((int)_Var4 < iVar22) {
              p_Var18 = p_Var17;
            }
            p_Var16 = (&p_Var19->_M_left)[(int)_Var4 < iVar22];
          } while ((&p_Var19->_M_left)[(int)_Var4 < iVar22] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var18 != p_Var3) {
            if ((int)_Var4 < iVar22) {
              p_Var19 = p_Var17;
            }
            if ((int)p_Var19[1]._M_color <= iVar22) {
              *piVar13 = *(int *)&p_Var18[1].field_0x4;
              piVar13 = piVar13 + 1;
            }
          }
        }
        piVar1 = piVar15 + 1;
        piVar15 = piVar15 + 1;
        iVar22 = *piVar1;
      }
      *piVar13 = -1;
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_a0,(pEVar8->super_FeatureIndex).maxid_,&local_a9);
    pdVar7 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = (long)(local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar7;
    if (lVar14 != 0) {
      lVar14 = lVar14 >> 3;
      lVar23 = 0;
      do {
        p_Var12 = &p_Var3->_M_header;
        p_Var18 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          do {
            p_Var16 = p_Var18;
            p_Var19 = p_Var12;
            _Var4 = p_Var16[1]._M_color;
            iVar22 = (int)lVar23;
            p_Var12 = p_Var16;
            if ((int)_Var4 < iVar22) {
              p_Var12 = p_Var19;
            }
            p_Var18 = (&p_Var16->_M_left)[(int)_Var4 < iVar22];
          } while ((&p_Var16->_M_left)[(int)_Var4 < iVar22] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var12 != p_Var3) {
            if ((int)_Var4 < iVar22) {
              p_Var16 = p_Var19;
            }
            if ((int)p_Var16[1]._M_color <= iVar22) {
              *(double *)
               (CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) +
               (long)*(int *)&p_Var12[1].field_0x4 * 8) = pdVar7[lVar23];
            }
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != lVar14 + (ulong)(lVar14 == 0));
    }
    std::vector<double,_std::allocator<double>_>::operator=(local_68,&local_a0);
    if ((void *)CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_a0.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_60);
    puVar20 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (puVar20 != (pointer)0x0) {
    operator_delete(puVar20);
  }
  return;
}

Assistant:

void EncoderFeatureIndex::shrink(size_t freq,
                                 std::vector<double> *observed) {
  std::vector<size_t> freqv;
  // count fvector
  freqv.resize(maxid_);
  for (std::map<std::string, std::pair<const int*, size_t> >::const_iterator
           it = feature_cache_.begin();
       it != feature_cache_.end(); ++it) {
    for (const int *f = it->second.first; *f != -1; ++f) {
      freqv[*f] += it->second.second;  // freq
    }
  }

  if (freq <= 1) {
    return;
  }

  // make old2new map
  maxid_ = 0;
  std::map<int, int> old2new;
  for (size_t i = 0; i < freqv.size(); ++i) {
    if (freqv[i] >= freq) {
      old2new.insert(std::pair<int, int>(i, maxid_++));
    }
  }

  // update dic_
  for (std::map<std::string, int>::iterator
           it = dic_.begin(); it != dic_.end();) {
    std::map<int, int>::const_iterator it2 = old2new.find(it->second);
    if (it2 != old2new.end()) {
      it->second = it2->second;
      ++it;
    } else {
      dic_.erase(it++);
    }
  }

  // update all fvector
  for (std::map<std::string, std::pair<const int*, size_t> >::const_iterator
           it = feature_cache_.begin(); it != feature_cache_.end(); ++it) {
    int *to = const_cast<int *>(it->second.first);
    for (const int *f = it->second.first; *f != -1; ++f) {
      std::map<int, int>::const_iterator it2 = old2new.find(*f);
      if (it2 != old2new.end()) {
        *to = it2->second;
        ++to;
      }
    }
    *to = -1;
  }

  // update observed vector
  std::vector<double> observed_new(maxid_);
  for (size_t i = 0; i < observed->size(); ++i) {
    std::map<int, int>::const_iterator it = old2new.find(static_cast<int>(i));
    if (it != old2new.end()) {
      observed_new[it->second] = (*observed)[i];
    }
  }

  // copy
  *observed = observed_new;

  return;
}